

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::CreateEntry
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *value,
          LogicalDependencyList *dependencies)

{
  bool bVar1;
  int iVar2;
  type pCVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  DependencyManager *this_00;
  mutex *__mutex;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_40;
  unique_lock<std::mutex> read_lock;
  
  pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator*(value);
  CheckCatalogEntryInvariants(this,pCVar3,name);
  pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(value);
  LOCK();
  (pCVar4->timestamp).super___atomic_base<unsigned_long>._M_i = transaction.transaction_id;
  UNLOCK();
  pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(value);
  (pCVar4->set).ptr = this;
  iVar2 = (*(this->catalog->super_Catalog)._vptr_Catalog[0x1a])();
  read_lock._M_device = (mutex_type *)CONCAT44(extraout_var,iVar2);
  this_00 = optional_ptr<duckdb::DependencyManager,_true>::operator->
                      ((optional_ptr<duckdb::DependencyManager,_true> *)&read_lock);
  pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator*(value);
  DependencyManager::AddObject(this_00,transaction,pCVar3,dependencies);
  __mutex = &this->catalog->write_lock;
  ::std::mutex::lock(__mutex);
  ::std::unique_lock<std::mutex>::unique_lock(&read_lock,&this->catalog_lock);
  local_40._M_head_impl =
       (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>).
       _M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
  bVar1 = CreateEntryInternal(this,transaction,name,
                              (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                               *)&local_40,&read_lock,true);
  if (local_40._M_head_impl != (CatalogEntry *)0x0) {
    (*(local_40._M_head_impl)->_vptr_CatalogEntry[1])();
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&read_lock);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar1;
}

Assistant:

bool CatalogSet::CreateEntry(CatalogTransaction transaction, const string &name, unique_ptr<CatalogEntry> value,
                             const LogicalDependencyList &dependencies) {
	CheckCatalogEntryInvariants(*value, name);

	// Mark this entry as being created by the current active transaction
	value->timestamp = transaction.transaction_id;
	value->set = this;
	catalog.GetDependencyManager()->AddObject(transaction, *value, dependencies);

	// lock the catalog for writing
	lock_guard<mutex> write_lock(catalog.GetWriteLock());
	// lock this catalog set to disallow reading
	unique_lock<mutex> read_lock(catalog_lock);

	return CreateEntryInternal(transaction, name, std::move(value), read_lock);
}